

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_server_name_is_ipaddr(char *name)

{
  int iVar1;
  char *in_RDI;
  sockaddr_in6 sin6;
  sockaddr_in sin;
  undefined1 local_3c [28];
  undefined1 local_20 [16];
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  iVar1 = inet_pton(2,in_RDI,local_20);
  if (iVar1 == 1) {
    local_4 = 1;
  }
  else {
    iVar1 = inet_pton(10,local_10,local_3c);
    if (iVar1 == 1) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ptls_server_name_is_ipaddr(const char *name)
{
#ifdef AF_INET
    struct sockaddr_in sin;
    if (inet_pton(AF_INET, name, &sin) == 1)
        return 1;
#endif
#ifdef AF_INET6
    struct sockaddr_in6 sin6;
    if (inet_pton(AF_INET6, name, &sin6) == 1)
        return 1;
#endif
    return 0;
}